

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void LodePNGText_cleanup(LodePNGInfo *info)

{
  size_t local_18;
  size_t i;
  LodePNGInfo *info_local;
  
  for (local_18 = 0; local_18 != info->text_num; local_18 = local_18 + 1) {
    string_cleanup(info->text_keys + local_18);
    string_cleanup(info->text_strings + local_18);
  }
  lodepng_free(info->text_keys);
  lodepng_free(info->text_strings);
  return;
}

Assistant:

static void LodePNGText_cleanup(LodePNGInfo* info)
{
  size_t i;
  for(i = 0; i != info->text_num; ++i)
  {
    string_cleanup(&info->text_keys[i]);
    string_cleanup(&info->text_strings[i]);
  }
  lodepng_free(info->text_keys);
  lodepng_free(info->text_strings);
}